

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_arrow(runtime_type *this,var *a,token_base *b)

{
  bool bVar1;
  type_info *this_00;
  token_base *b_00;
  runtime_error *this_01;
  allocator local_41;
  string local_40;
  
  this_00 = cs_impl::any::type((any *)b);
  bVar1 = std::type_info::operator==(this_00,(type_info *)&pointer::typeinfo);
  if (bVar1) {
    b_00 = (token_base *)cs_impl::any::const_val<cs::pointer>((any *)b);
    parse_dot(this,a,b_00);
    return (var)(proxy *)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_40,"Unsupported operator operations(Arraw).",&local_41);
  runtime_error::runtime_error(this_01,&local_40);
  __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_arrow(const var &a, token_base *b)
	{
		if (a.type() == typeid(pointer))
			return parse_dot(a.const_val<pointer>().data, b);
		else
			throw runtime_error("Unsupported operator operations(Arraw).");
	}